

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O0

int Ga2_ObjFindOrAddLit(Ga2_Man_t *p,Gia_Obj_t *pObj,int f)

{
  int v;
  int local_20;
  int Lit;
  int f_local;
  Gia_Obj_t *pObj_local;
  Ga2_Man_t *p_local;
  
  local_20 = Ga2_ObjFindLit(p,pObj,f);
  if (local_20 == -1) {
    v = p->nSatVars;
    p->nSatVars = v + 1;
    local_20 = toLitCond(v,0);
    Ga2_ObjAddLit(p,pObj,f,local_20);
  }
  return local_20;
}

Assistant:

static inline int Ga2_ObjFindOrAddLit( Ga2_Man_t * p, Gia_Obj_t * pObj, int f )  
{ 
    int Lit = Ga2_ObjFindLit( p, pObj, f );
    if ( Lit == -1 )
    {
        Lit = toLitCond( p->nSatVars++, 0 );
        Ga2_ObjAddLit( p, pObj, f, Lit );
    }
//    assert( Lit > 1 );
    return Lit;
}